

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O2

void PSOAdaption(Particle *particle,myRep *rep,double w,int it)

{
  uint n;
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double **tmp;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  n = particle->sizeOfPosition;
  iVar4 = rouletteWheel(rep);
  cpyDoubleArray(&particle->old_position,&particle->Position,n);
  dVar3 = c2;
  dVar2 = c1;
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  iVar5 = iVar5 + 1;
  do {
    rep = (myRep *)(((_List_base<Rep,_std::allocator<Rep>_> *)&((_List_node_base *)rep)->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  tmp = &particle->Velocity;
  uVar9 = 0;
  uVar8 = (ulong)n;
  if ((int)n < 1) {
    uVar8 = uVar9;
  }
  while( true ) {
    if (uVar8 == uVar9) break;
    iVar5 = rand();
    iVar4 = rand();
    if ((it == 0) && ((int)(uVar9 / 3) * 3 + 1 != (int)uVar9)) {
      iVar6 = rand();
      dVar10 = (double)iVar6 / 2147483647.0;
      pdVar7 = *tmp;
      pdVar7[uVar9] = dVar10;
    }
    else {
      pdVar7 = *tmp;
      dVar10 = pdVar7[uVar9];
    }
    pdVar7[uVar9] =
         (*(double *)((long)((_List_node_base *)((long)rep + 0x20))->_M_next + uVar9 * 8) -
         particle->Position[uVar9]) * ((double)iVar4 / 2147483647.0) * dVar3 +
         dVar10 * w +
         ((particle->Best).Position[uVar9] - particle->Position[uVar9]) *
         ((double)iVar5 / 2147483647.0) * dVar2;
    uVar9 = uVar9 + 1;
  }
  checkV(tmp,particle->sizeOfVelocity);
  pdVar7 = particle->Position;
  pdVar1 = particle->Velocity;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pdVar7[uVar9] = pdVar1[uVar9] + pdVar7[uVar9];
  }
  checkP(&particle->Position,tmp,particle->sizeOfPosition);
  return;
}

Assistant:

void PSOAdaption(Particle & particle, myRep & rep, double w, int it) {
    int len = particle.sizeOfPosition;
    int h = rouletteWheel(rep);
    cpyDoubleArray(particle.old_position, particle.Position, len);
    myRep ::iterator a = rep.begin();
    for (int i=0; i<h; i++) a++;
    //  calculate the new Velocity
    for (int i=0; i<len; i++){
        double r1 = rand() / double(RAND_MAX) , r2 = rand() / double(RAND_MAX) ;
        //double r1=0.7, r2=0.7;
        if(it==0 && i%3 != 1) particle.Velocity[i] = rand() / double(RAND_MAX);
        //if(it==0 && i%3 != 1) particle.Velocity[i] = 0.7;
        particle.Velocity[i] = w * particle.Velocity[i] +
                               c1*r1* (particle.Best.Position[i] - particle.Position[i]) +
                               c2*r2 * (a->Position[i] - particle.Position[i]);
    }

    checkV(particle.Velocity, particle.sizeOfVelocity);

    //  calculate the new position
    for (int i=0; i<len; i++)   particle.Position[i] += particle.Velocity[i];

    checkP(particle.Position, particle.Velocity, particle.sizeOfPosition);
}